

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void gen_ldxs(DisasContext_conflict6 *ctx,int base,int index,int rd)

{
  TCGContext_conflict6 *s;
  TCGContext_conflict6 *tcg_ctx;
  TCGTemp *a1;
  TCGTemp *a1_00;
  TCGv_i64 pTVar1;
  TCGOpcode opc;
  uintptr_t o_3;
  uintptr_t o_2;
  TCGv_i64 ret;
  
  s = ctx->uc->tcg_ctx;
  a1 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
  ret = (TCGv_i64)((long)a1 - (long)s);
  a1_00 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
  if (base == 0) {
    opc = INDEX_op_movi_i64;
    pTVar1 = (TCGv_i64)0x0;
  }
  else {
    if (s->cpu_gpr[base] == ret) goto LAB_00993ad0;
    pTVar1 = s->cpu_gpr[base] + (long)s;
    opc = INDEX_op_mov_i64;
  }
  tcg_gen_op2_mips64el(s,opc,(TCGArg)a1,(TCGArg)pTVar1);
LAB_00993ad0:
  pTVar1 = (TCGv_i64)((long)a1_00 - (long)s);
  if (index != 0) {
    if (s->cpu_gpr[index] != pTVar1) {
      tcg_gen_op2_mips64el(s,INDEX_op_mov_i64,(TCGArg)a1_00,(TCGArg)(s->cpu_gpr[index] + (long)s));
    }
    tcg_gen_shli_i64_mips64el(s,pTVar1,pTVar1,2);
    tcg_ctx = ctx->uc->tcg_ctx;
    tcg_gen_op3_mips64el
              (tcg_ctx,INDEX_op_add_i64,(TCGArg)((long)tcg_ctx + (long)ret),
               (TCGArg)((long)tcg_ctx + (long)pTVar1),(TCGArg)((long)tcg_ctx + (long)ret));
    if ((ctx->hflags & 0x200) != 0) {
      tcg_gen_ext32s_i64_mips64el(tcg_ctx,ret,ret);
    }
  }
  tcg_gen_qemu_ld_i64_mips64el(s,pTVar1,ret,(long)ctx->mem_idx,MO_LESL);
  if ((rd != 0) && (s->cpu_gpr[rd] != pTVar1)) {
    tcg_gen_op2_mips64el(s,INDEX_op_mov_i64,(TCGArg)(s->cpu_gpr[rd] + (long)s),(TCGArg)a1_00);
  }
  tcg_temp_free_internal_mips64el(s,(TCGTemp *)(ret + (long)s));
  tcg_temp_free_internal_mips64el(s,(TCGTemp *)(pTVar1 + (long)s));
  return;
}

Assistant:

static void gen_ldxs(DisasContext *ctx, int base, int index, int rd)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv t0 = tcg_temp_new(tcg_ctx);
    TCGv t1 = tcg_temp_new(tcg_ctx);

    gen_load_gpr(tcg_ctx, t0, base);

    if (index != 0) {
        gen_load_gpr(tcg_ctx, t1, index);
        tcg_gen_shli_tl(tcg_ctx, t1, t1, 2);
        gen_op_addr_add(ctx, t0, t1, t0);
    }

    tcg_gen_qemu_ld_tl(tcg_ctx, t1, t0, ctx->mem_idx, MO_TESL);
    gen_store_gpr(tcg_ctx, t1, rd);

    tcg_temp_free(tcg_ctx, t0);
    tcg_temp_free(tcg_ctx, t1);
}